

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

size_t chacha_update(chacha_state *S,uint8_t *in,uint8_t *out,size_t inlen)

{
  long lVar1;
  ulong inlen_00;
  uint8_t *puVar2;
  size_t __n;
  
  lVar1 = *(long *)(S->opaque + 0x38);
  puVar2 = out;
  if (0x3f < inlen + lVar1) {
    if (lVar1 != 0) {
      __n = 0x40 - lVar1;
      if (in == (uint8_t *)0x0) {
        in = (uint8_t *)0x0;
      }
      else {
        memcpy(S->opaque + lVar1 + 0x40,in,__n);
        in = in + __n;
      }
      puVar2 = S->opaque + 0x40;
      if (in == (uint8_t *)0x0) {
        puVar2 = (uint8_t *)0x0;
      }
      chacha_consume((chacha_state_internal *)S,puVar2,out,0x40);
      inlen = inlen - __n;
      S->opaque[0x38] = '\0';
      S->opaque[0x39] = '\0';
      S->opaque[0x3a] = '\0';
      S->opaque[0x3b] = '\0';
      S->opaque[0x3c] = '\0';
      S->opaque[0x3d] = '\0';
      S->opaque[0x3e] = '\0';
      S->opaque[0x3f] = '\0';
      puVar2 = out + 0x40;
    }
    inlen_00 = inlen & 0xffffffffffffffc0;
    if (inlen_00 != 0) {
      chacha_consume((chacha_state_internal *)S,in,puVar2,inlen_00);
      inlen = (size_t)((uint)inlen & 0x3f);
      if (in != (uint8_t *)0x0) {
        in = in + inlen_00;
      }
      puVar2 = puVar2 + inlen_00;
    }
  }
  if (inlen != 0) {
    if (in == (uint8_t *)0x0) {
      memset(S->opaque + *(long *)(S->opaque + 0x38) + 0x40,0,inlen);
    }
    else {
      memcpy(S->opaque + *(long *)(S->opaque + 0x38) + 0x40,in,inlen);
    }
    *(size_t *)(S->opaque + 0x38) = *(long *)(S->opaque + 0x38) + inlen;
  }
  return (long)puVar2 - (long)out;
}

Assistant:

size_t
chacha_update(chacha_state *S, const uint8_t *in, uint8_t *out, size_t inlen) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    uint8_t *out_start = out;
    size_t bytes;

    /* enough for at least one block? */
    if ((state->leftover + inlen) >= CHACHA_BLOCKBYTES) {
        /* handle the previous data */
        if (state->leftover) {
            bytes = (CHACHA_BLOCKBYTES - state->leftover);
            if (in) {
                memcpy(state->buffer + state->leftover, in, bytes);
                in += bytes;
            }
            chacha_consume(state, (in) ? state->buffer : NULL, out, CHACHA_BLOCKBYTES);
            inlen -= bytes;
            out += CHACHA_BLOCKBYTES;
            state->leftover = 0;
        }

        /* handle the direct data */
        bytes = (inlen & ~(CHACHA_BLOCKBYTES - 1));
        if (bytes) {
            chacha_consume(state, in, out, bytes);
            inlen -= bytes;
            if (in) in += bytes;
            out += bytes;
        }
    }

    /* handle leftover data */
    if (inlen) {
        if (in) memcpy(state->buffer + state->leftover, in, inlen);
        else memset(state->buffer + state->leftover, 0, inlen);
        state->leftover += inlen;
    }

    return out - out_start;
}